

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

u16string * __thiscall
TextBuffer::Layer::text_in_range_abi_cxx11_
          (u16string *__return_storage_ptr__,Layer *this,Range range,bool splay)

{
  anon_class_8_1_6971b95b local_a8;
  ClipResult local_a0;
  Point local_90;
  ClipResult local_88;
  Point local_78;
  ClipResult local_70;
  Layer *local_50;
  ClipResult local_48;
  Point local_38;
  undefined1 local_2a;
  byte local_29;
  Layer *pLStack_28;
  bool splay_local;
  Layer *this_local;
  Range range_local;
  u16string *result;
  
  range_local.start = range.end;
  this_local = (Layer *)range.start;
  local_2a = 0;
  local_29 = splay;
  pLStack_28 = this;
  range_local.end = (Point)__return_storage_ptr__;
  std::__cxx11::u16string::u16string((u16string *)__return_storage_ptr__);
  local_50 = this_local;
  local_70 = clip_position(this,(Point)this_local,false);
  local_38 = local_70.position;
  local_90 = range_local.start;
  local_48 = local_70;
  local_a0 = clip_position(this,range_local.start,false);
  local_78 = local_a0.position;
  local_a8.result = __return_storage_ptr__;
  local_88 = local_a0;
  for_each_chunk_in_range<TextBuffer::Layer::text_in_range[abi:cxx11](Range,bool)::_lambda(TextSlice)_1_>
            (this,local_38,local_78,&local_a8,(bool)(local_29 & 1));
  return __return_storage_ptr__;
}

Assistant:

u16string text_in_range(Range range, bool splay = false) {
    u16string result;
    for_each_chunk_in_range(
      clip_position(range.start).position,
      clip_position(range.end).position,
      [&result](TextSlice slice) {
        result.insert(result.end(), slice.begin(), slice.end());
        return false;
      },
      splay
    );
    return result;
  }